

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::D3MFImporter::CanRead
          (D3MFImporter *this,string *filename,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  long lVar2;
  undefined1 local_70 [8];
  D3MFOpcPackage opcPackage;
  undefined1 local_50 [8];
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *filename_local;
  D3MFImporter *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,filename);
  bVar1 = std::operator==((string *)local_50,(char *)0xc6373b);
  if (bVar1) {
    this_local._7_1_ = true;
    opcPackage.mZipArchive._M_t.
    super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
    ._M_t.
    super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
    .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl._0_4_ = 1;
  }
  else {
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 == 0) || ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
      if (pIOHandler == (IOSystem *)0x0) {
        this_local._7_1_ = false;
        opcPackage.mZipArchive._M_t.
        super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
        ._M_t.
        super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
        .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        bVar1 = ZipArchiveIOSystem::isZipArchive(pIOHandler,filename);
        if (bVar1) {
          D3MF::D3MFOpcPackage::D3MFOpcPackage((D3MFOpcPackage *)local_70,pIOHandler,filename);
          this_local._7_1_ = D3MF::D3MFOpcPackage::validate((D3MFOpcPackage *)local_70);
          opcPackage.mZipArchive._M_t.
          super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
          .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl._0_4_ = 1;
          D3MF::D3MFOpcPackage::~D3MFOpcPackage((D3MFOpcPackage *)local_70);
        }
        else {
          this_local._7_1_ = false;
          opcPackage.mZipArchive._M_t.
          super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
          ._M_t.
          super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
          .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl._0_4_ = 1;
        }
      }
    }
    else {
      this_local._7_1_ = false;
      opcPackage.mZipArchive._M_t.
      super___uniq_ptr_impl<Assimp::ZipArchiveIOSystem,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
      ._M_t.
      super__Tuple_impl<0UL,_Assimp::ZipArchiveIOSystem_*,_std::default_delete<Assimp::ZipArchiveIOSystem>_>
      .super__Head_base<0UL,_Assimp::ZipArchiveIOSystem_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
  std::__cxx11::string::~string((string *)local_50);
  return this_local._7_1_;
}

Assistant:

bool D3MFImporter::CanRead(const std::string &filename, IOSystem *pIOHandler, bool checkSig) const {
    const std::string extension( GetExtension( filename ) );
    if(extension == desc.mFileExtensions ) {
        return true;
    } else if ( !extension.length() || checkSig ) {
        if ( nullptr == pIOHandler ) {
            return false;
        }
        if ( !ZipArchiveIOSystem::isZipArchive( pIOHandler, filename ) ) {
            return false;
        }
        D3MF::D3MFOpcPackage opcPackage( pIOHandler, filename );
        return opcPackage.validate();
    }

    return false;
}